

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx2::PointsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,range<unsigned_long> *r,
          size_t k,uint geomID)

{
  undefined1 auVar1 [16];
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  float fVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  undefined4 uVar10;
  size_t sVar11;
  size_t sVar12;
  uint index;
  ulong uVar13;
  long lVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  
  aVar15.m128[2] = INFINITY;
  aVar15._0_8_ = 0x7f8000007f800000;
  aVar15.m128[3] = INFINITY;
  auVar16 = ZEXT1664((undefined1  [16])aVar15);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar15;
  aVar17.m128[2] = -INFINITY;
  aVar17._0_8_ = 0xff800000ff800000;
  aVar17.m128[3] = -INFINITY;
  auVar18 = ZEXT1664((undefined1  [16])aVar17);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar17;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar15;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar17;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar13 = r->_begin;
  sVar11 = __return_storage_ptr__->end;
  aVar21 = aVar15;
  aVar19 = aVar17;
  if (uVar13 < r->_end) {
    auVar23._8_4_ = 0xddccb9a2;
    auVar23._0_8_ = 0xddccb9a2ddccb9a2;
    auVar23._12_4_ = 0xddccb9a2;
    auVar24._8_4_ = 0x5dccb9a2;
    auVar24._0_8_ = 0x5dccb9a25dccb9a2;
    auVar24._12_4_ = 0x5dccb9a2;
    auVar22 = ZEXT1664((undefined1  [16])aVar15);
    auVar20 = ZEXT1664((undefined1  [16])aVar17);
    do {
      pBVar2 = (this->super_Points).vertices.items;
      if ((uVar13 & 0xffffffff) < (pBVar2->super_RawBufferView).num) {
        lVar14 = 0;
        bVar8 = false;
        do {
          bVar7 = bVar8;
          if (bVar7) break;
          pcVar3 = pBVar2[lVar14].super_RawBufferView.ptr_ofs;
          lVar14 = pBVar2[lVar14].super_RawBufferView.stride * (uVar13 & 0xffffffff);
          if (*(float *)(pcVar3 + lVar14 + 0xc) < 0.0) break;
          auVar1 = *(undefined1 (*) [16])(pcVar3 + lVar14);
          auVar25 = vcmpps_avx(auVar1,auVar23,2);
          auVar1 = vcmpps_avx(auVar1,auVar24,5);
          auVar1 = vorps_avx(auVar25,auVar1);
          uVar10 = vmovmskps_avx(auVar1);
          lVar14 = 1;
          bVar8 = true;
        } while ((char)uVar10 == '\0');
      }
      else {
        bVar7 = false;
      }
      sVar12 = k;
      if (bVar7) {
        lVar14 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
        lVar9 = *(long *)&(this->super_Points).field_0x68 * uVar13;
        fVar6 = *(float *)(lVar14 + 0xc + lVar9) * (this->super_Points).maxRadiusScale;
        auVar1 = *(undefined1 (*) [16])(lVar14 + lVar9);
        auVar25._4_4_ = fVar6;
        auVar25._0_4_ = fVar6;
        auVar25._8_4_ = fVar6;
        auVar25._12_4_ = fVar6;
        auVar25 = vsubps_avx(auVar1,auVar25);
        auVar26._0_4_ = auVar1._0_4_ + fVar6;
        auVar26._4_4_ = auVar1._4_4_ + fVar6;
        auVar26._8_4_ = auVar1._8_4_ + fVar6;
        auVar26._12_4_ = auVar1._12_4_ + fVar6;
        aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar25,ZEXT416(geomID),0x30);
        aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar26,ZEXT416((uint)uVar13),0x30);
        auVar1 = vminps_avx(auVar16._0_16_,(undefined1  [16])aVar4);
        auVar16 = ZEXT1664(auVar1);
        auVar1 = vmaxps_avx(auVar18._0_16_,(undefined1  [16])aVar5);
        auVar18 = ZEXT1664(auVar1);
        auVar27._0_4_ = aVar5.x + aVar4.x;
        auVar27._4_4_ = aVar5.y + aVar4.y;
        auVar27._8_4_ = aVar5.z + aVar4.z;
        auVar27._12_4_ = aVar5.field_3.w + aVar4.field_3.w;
        auVar1 = vminps_avx(auVar22._0_16_,auVar27);
        auVar22 = ZEXT1664(auVar1);
        auVar1 = vmaxps_avx(auVar20._0_16_,auVar27);
        auVar20 = ZEXT1664(auVar1);
        sVar11 = sVar11 + 1;
        sVar12 = k + 1;
        prims[k].lower.field_0.field_1 = aVar4;
        prims[k].upper.field_0.field_1 = aVar5;
      }
      aVar19 = auVar20._0_16_;
      aVar21 = auVar22._0_16_;
      aVar17 = auVar18._0_16_;
      aVar15 = auVar16._0_16_;
      uVar13 = uVar13 + 1;
      k = sVar12;
    } while (uVar13 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar15;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar17;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar21;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar19;
  __return_storage_ptr__->end = sVar11;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, &bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }